

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

Iterator<TestType,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::operator++
          (Iterator<TestType,_false,_std::allocator<unsigned_long>_> *this)

{
  ulong uVar1;
  value_type vVar2;
  View<TestType,_false,_std::allocator<unsigned_long>_> *this_00;
  bool bVar3;
  size_t sVar4;
  CoordinateOrder *pCVar5;
  size_type sVar6;
  reference pvVar7;
  reference pTVar8;
  size_type local_20;
  size_t j_1;
  size_t j;
  Iterator<TestType,_false,_std::allocator<unsigned_long>_> *this_local;
  
  marray_detail::Assert<bool>(this->view_ != (view_pointer)0x0);
  uVar1 = this->index_;
  sVar4 = View<TestType,_false,_std::allocator<unsigned_long>_>::size(this->view_);
  if (uVar1 < sVar4) {
    this->index_ = this->index_ + 1;
    bVar3 = View<TestType,_false,_std::allocator<unsigned_long>_>::isSimple(this->view_);
    if (bVar3) {
      this->pointer_ = this->pointer_ + 1;
    }
    else {
      uVar1 = this->index_;
      sVar4 = View<TestType,_false,_std::allocator<unsigned_long>_>::size(this->view_);
      if (uVar1 < sVar4) {
        pCVar5 = View<TestType,_false,_std::allocator<unsigned_long>_>::coordinateOrder(this->view_)
        ;
        if (*pCVar5 == LastMajorOrder) {
          for (j_1 = 0; sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                          (&this->coordinates_), j_1 < sVar6; j_1 = j_1 + 1) {
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->coordinates_,j_1);
            vVar2 = *pvVar7;
            sVar4 = View<TestType,_false,_std::allocator<unsigned_long>_>::shape(this->view_,j_1);
            if (vVar2 != sVar4 - 1) {
              sVar4 = View<TestType,_false,_std::allocator<unsigned_long>_>::strides
                                (this->view_,j_1);
              this->pointer_ = this->pointer_ + sVar4;
              pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&this->coordinates_,j_1);
              *pvVar7 = *pvVar7 + 1;
              break;
            }
            sVar4 = View<TestType,_false,_std::allocator<unsigned_long>_>::strides(this->view_,j_1);
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->coordinates_,j_1);
            this->pointer_ = this->pointer_ + -(sVar4 * *pvVar7);
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->coordinates_,j_1);
            *pvVar7 = 0;
          }
        }
        else {
          local_20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                               (&this->coordinates_);
          do {
            local_20 = local_20 - 1;
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->coordinates_,local_20);
            vVar2 = *pvVar7;
            sVar4 = View<TestType,_false,_std::allocator<unsigned_long>_>::shape
                              (this->view_,local_20);
            if (vVar2 != sVar4 - 1) {
              sVar4 = View<TestType,_false,_std::allocator<unsigned_long>_>::strides
                                (this->view_,local_20);
              this->pointer_ = this->pointer_ + sVar4;
              pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&this->coordinates_,local_20);
              *pvVar7 = *pvVar7 + 1;
              break;
            }
            sVar4 = View<TestType,_false,_std::allocator<unsigned_long>_>::strides
                              (this->view_,local_20);
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->coordinates_,local_20);
            this->pointer_ = this->pointer_ + -(sVar4 * *pvVar7);
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->coordinates_,local_20);
            *pvVar7 = 0;
          } while (local_20 != 0);
        }
      }
      else {
        this_00 = this->view_;
        sVar4 = View<TestType,_false,_std::allocator<unsigned_long>_>::size(this->view_);
        pTVar8 = View<TestType,_false,_std::allocator<unsigned_long>_>::operator()
                           (this_00,sVar4 - 1);
        this->pointer_ = pTVar8 + 1;
        pCVar5 = View<TestType,_false,_std::allocator<unsigned_long>_>::coordinateOrder(this->view_)
        ;
        if (*pCVar5 == LastMajorOrder) {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->coordinates_,0);
          *pvVar7 = *pvVar7 + 1;
        }
        else {
          sVar4 = View<TestType,_false,_std::allocator<unsigned_long>_>::dimension(this->view_);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->coordinates_,sVar4 - 1);
          *pvVar7 = *pvVar7 + 1;
        }
      }
    }
  }
  testInvariant(this);
  return this;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator++()
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    if(index_ < view_->size()) { // view initialized and iterator not at the end
        ++index_;
        if(view_->isSimple()) {
            ++pointer_;
        }
        else {
            if(index_ < view_->size()) {
                if(view_->coordinateOrder() == LastMajorOrder) {
                    for(std::size_t j=0; j<coordinates_.size(); ++j) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                    }
                }
                else { // FirstMajorOrder
                    std::size_t j = coordinates_.size() - 1;
                    for(;;) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                        if(j == 0) {
                            break;
                        }
                        else {
                            --j;
                        }
                    }
                }
            }
            else {
                // set to end iterator
                pointer_ = &((*view_)(view_->size()-1)) + 1;
                if(view_->coordinateOrder() == LastMajorOrder) {
                    ++coordinates_[0];
                }
                else { // FirstMajorOrder
                    ++coordinates_[view_->dimension()-1];
                }
            }
        }
    }
    testInvariant();
    return *this;
}